

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall CVmObjPattern::notify_delete(CVmObjPattern *this,int in_root_set)

{
  vmobj_pat_ext *pvVar1;
  CVmVarHeap *pCVar2;
  int in_ESI;
  CVmObjPattern *in_RDI;
  
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    pvVar1 = get_ext(in_RDI);
    if (pvVar1->pat != (re_compiled_pattern *)0x0) {
      get_ext(in_RDI);
      CRegexParser::free_pattern((re_compiled_pattern *)0x38014d);
    }
    if (in_ESI == 0) {
      pCVar2 = CVmMemory::get_var_heap(G_mem_X);
      (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,(in_RDI->super_CVmObject).ext_);
    }
  }
  return;
}

Assistant:

void CVmObjPattern::notify_delete(VMG_ int in_root_set)
{
    /* free my extension data */
    if (ext_ != 0)
    {
        /* 
         *   Free my pattern, if I've compiled it.  (Note that we must not
         *   call get_pattern() here, because doing so would unnecessarily
         *   create a pattern if we haven't already done so - that would be
         *   stupid, because the only reason we're asking for it is so that
         *   we can delete it.)  
         */
        if (get_ext()->pat != 0)
            CRegexParser::free_pattern(get_ext()->pat);

        /* free the extension */
        if (!in_root_set)
            G_mem->get_var_heap()->free_mem(ext_);
    }
}